

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
          *range,basic_string_view<char,_std::char_traits<char>_> *separator)

{
  anon_class_24_2_e8cc7173 __f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  iterator_adaptor<std::reverse_iterator<const_int_*>,_const_ezy::to_string_fn_&> local_50;
  iterator_adaptor<std::reverse_iterator<const_int_*>,_const_ezy::to_string_fn_&> local_40;
  anon_class_24_2_e8cc7173 local_30;
  
  to_string_fn::operator()
            (__return_storage_ptr__,*(to_string_fn **)(this + 8),(int *)(**(long **)this + 0xc));
  local_50.converter = *(to_string_fn **)(this + 8);
  local_50.super_basic_iterator_adaptor<std::reverse_iterator<const_int_*>_>.orig.current =
       (reverse_iterator<const_int_*>)**(long **)this;
  local_40.super_basic_iterator_adaptor<std::reverse_iterator<const_int_*>_>.orig.current =
       (reverse_iterator<const_int_*>)
       ((long)local_50.super_basic_iterator_adaptor<std::reverse_iterator<const_int_*>_>.orig.
              current + 0xc);
  __f.separator._M_len = (size_t)(range->orig_range).t;
  __f.result = __return_storage_ptr__;
  __f.separator._M_str = (char *)range->transformation;
  local_40.converter = local_50.converter;
  std::
  for_each<ezy::detail::iterator_adaptor<std::reverse_iterator<int_const*>,ezy::to_string_fn_const&>,ezy::join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>(ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>&&,std::basic_string_view<char,std::char_traits<char>>&)::_lambda(auto:1_const&)_1_>
            (&local_30,&local_40,&local_50,__f);
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }